

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf2.c
# Opt level: O1

double time_op(int g_a,double *buf_,int chunk,int loop,int proc,int ndim,int op)

{
  int *lo;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  int ld;
  double alpha;
  int local_58 [5];
  int local_44;
  double local_40;
  undefined8 local_38;
  
  local_58[2] = -1;
  local_58[3] = -1;
  local_58[0] = -1;
  local_58[1] = -1;
  local_44 = -1;
  local_38 = 0x3ff0000000000000;
  NGA_Distribution(g_a,proc,local_58 + 2,local_58);
  if (ndim == 1) {
    local_58[0] = local_58[2] + chunk * chunk + -1;
  }
  else {
    local_58[1] = chunk + -1 + local_58[3];
    local_58[0] = local_58[2] + chunk + -1;
    local_44 = chunk;
  }
  bVar1 = false;
  local_40 = armci_timer();
  local_58[4] = loop;
  if (0 < loop) {
    do {
      lo = local_58 + 2;
      if (op == 2) {
        NGA_Acc(g_a,lo,local_58,buf_,&local_44,&local_38);
      }
      else if (op == 1) {
        NGA_Put(g_a,lo,local_58,buf_,&local_44);
      }
      else {
        NGA_Get(g_a,lo,local_58,buf_,&local_44);
      }
      if (bVar1) {
        local_58[3] = local_58[3] + -0x80;
        local_58[2] = local_58[2] + -0x80;
        iVar3 = local_58[0] + -0x80;
        lVar4 = -0x400;
        iVar2 = -0x80;
      }
      else {
        iVar2 = 0x80;
        local_58[3] = local_58[3] + 0x80;
        local_58[2] = local_58[2] + 0x80;
        iVar3 = local_58[0] + 0x80;
        lVar4 = 0x400;
      }
      bVar1 = !bVar1;
      local_58[1] = local_58[1] + iVar2;
      local_58[0] = iVar3;
      buf_ = (double *)((long)buf_ + lVar4);
      loop = loop + -1;
    } while (loop != 0);
  }
  dVar5 = armci_timer();
  dVar5 = dVar5 - local_40;
  if ((dVar5 == 0.0) && (!NAN(dVar5))) {
    warn_accuracy = warn_accuracy + 1;
    dVar5 = 1e-06;
  }
  return dVar5 / (double)local_58[4];
}

Assistant:

double time_op(int g_a, double *buf_, int chunk, int loop, int proc,
               int ndim, int op)
{
  double start_time = 0;
  double stop_time = 0;
  double total_time = 0;
  int lo[2] = {-1,-1};
  int hi[2] = {-1,-1};
  int ld = -1;
  int i = 0;
  int bal = 0;
  double *buf = buf_;
  double alpha = 1;

  /* get the location within the g_a for the given proc */
  NGA_Distribution(g_a, proc, lo, hi);
  /* determine how much data to grab based on the chunk and dimensionality */
  if (ndim == 1) {
    hi[0] = lo[0] + chunk*chunk - 1;
  }
  else if (ndim == 2) {
    hi[0] = lo[0] + chunk - 1;
    hi[1] = lo[1] + chunk - 1;
    ld = chunk;
  }
  else {
    GA_Error("invalid ndim for time_op", ndim);
  }

  start_time = TIMER();
  for (i=0; i<loop; ++i) {
    switch (op) {
      case OP_GET:
        NGA_Get(g_a, lo, hi, buf, &ld);
        break;
      case OP_PUT:
        NGA_Put(g_a, lo, hi, buf, &ld);
        break;
      case OP_ACC:
        NGA_Acc(g_a, lo, hi, buf, &ld, &alpha);
        break;
      default:
        GA_Error("bad case value for op", op);
    }
    /* prepare next src location and dst ptr: avoid cache locality */
    if (bal == 0) {
      lo[0] += 128;
      lo[1] += 128;
      hi[0] += 128;
      hi[1] += 128;
      buf += 128;
      bal = 1;
    }
    else {
      lo[0] -= 128;
      lo[1] -= 128;
      hi[0] -= 128;
      hi[1] -= 128;
      buf -= 128;
      bal = 0;
    }
  }
  stop_time = TIMER();
  total_time = (stop_time - start_time);
  if (total_time == 0.0) {
    total_time = 0.000001; /* workaround for inaccurate timers */
    warn_accuracy++;
  }

  return(total_time / loop);
}